

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

bool __thiscall QStyleSheetStyle::initObject(QStyleSheetStyle *this,QObject *obj)

{
  bool bVar1;
  bool bVar2;
  QWidget *pQVar3;
  QFrame *pQVar4;
  QComboBox *pQVar5;
  QMetaObject *pQVar6;
  QTabBar *pQVar7;
  long in_FS_OFFSET;
  Object local_40 [8];
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (obj != (QObject *)0x0) {
    if ((*(byte *)(*(long *)(obj + 8) + 0x30) & 1) == 0) {
LAB_00342249:
      local_38.d = (Data *)QStyleSheetStyleCaches::objectDestroyed;
      local_38.ptr = (char16_t *)0x0;
      QObject::connect<void(QObject::*)(QObject*),void(QStyleSheetStyleCaches::*)(QObject*)>
                (local_40,(offset_in_QObject_to_subr)obj,(ContextType *)QObject::destroyed,
                 (offset_in_QStyleSheetStyleCaches_to_subr *)0x0,(ConnectionType)styleSheetCaches);
      QMetaObject::Connection::~Connection((Connection *)local_40);
      bVar1 = true;
      goto LAB_003422af;
    }
    bVar2 = QWidget::testAttribute_helper((QWidget *)obj,WA_StyleSheet);
    bVar1 = true;
    if (bVar2) goto LAB_003422af;
    if (*(char *)(*(long *)(obj + 0x20) + 0xc) != '\x11') {
      QWidget::styleSheet((QString *)&local_38,(QWidget *)obj);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      if ((local_38.size != 0) ||
         (((pQVar3 = containerWidget((QWidget *)obj), pQVar3 == (QWidget *)obj &&
           ((pQVar4 = QtPrivate::qobject_cast_helper<QFrame_const*,QObject_const>(obj),
            pQVar4 == (QFrame *)0x0 ||
            (pQVar5 = QtPrivate::qobject_cast_helper<QComboBox_const*,QObject>
                                (*(QObject **)(*(long *)(obj + 8) + 0x10)),
            pQVar5 == (QComboBox *)0x0)))) &&
          ((pQVar6 = (QMetaObject *)(*(code *)**(undefined8 **)obj)(obj),
           pQVar6 != &QWidget::staticMetaObject ||
           (pQVar7 = QtPrivate::qobject_cast_helper<QTabBar_const*,QObject>
                               (*(QObject **)(*(long *)(obj + 8) + 0x10)), pQVar7 == (QTabBar *)0x0)
           ))))) {
        QWidget::setAttribute((QWidget *)obj,WA_StyleSheet,true);
        goto LAB_00342249;
      }
    }
  }
  bVar1 = false;
LAB_003422af:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QStyleSheetStyle::initObject(const QObject *obj) const
{
    if (!obj)
        return false;
    if (const QWidget *w = qobject_cast<const QWidget*>(obj)) {
        if (w->testAttribute(Qt::WA_StyleSheet))
            return true;
        if (unstylable(w))
            return false;
        const_cast<QWidget *>(w)->setAttribute(Qt::WA_StyleSheet, true);
    }

    connect(obj, &QObject::destroyed,
            styleSheetCaches, &QStyleSheetStyleCaches::objectDestroyed,
            Qt::UniqueConnection);
    return true;
}